

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_SetRGB(GPU_Image *image,Uint8 r,Uint8 g,Uint8 b)

{
  if (image != (GPU_Image *)0x0) {
    (image->color).r = r;
    (image->color).g = g;
    (image->color).b = b;
    (image->color).a = 0xff;
  }
  return;
}

Assistant:

void GPU_SetRGB(GPU_Image* image, Uint8 r, Uint8 g, Uint8 b)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = 255;

    if(image == NULL)
        return;

    image->color = c;
}